

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-utils.h
# Opt level: O0

_Bool plutovg_skip_ws(char **begin,char *end)

{
  bool bVar1;
  char *local_20;
  char *it;
  char *end_local;
  char **begin_local;
  
  local_20 = *begin;
  while( true ) {
    bVar1 = false;
    if ((((local_20 < end) && (bVar1 = true, *local_20 != ' ')) && (bVar1 = true, *local_20 != '\t')
        ) && (bVar1 = true, *local_20 != '\n')) {
      bVar1 = *local_20 == '\r';
    }
    if (!bVar1) break;
    local_20 = local_20 + 1;
  }
  *begin = local_20;
  return local_20 < end;
}

Assistant:

static inline bool plutovg_skip_ws(const char** begin, const char* end)
{
    const char* it = *begin;
    while(it < end && PLUTOVG_IS_WS(*it))
        ++it;
    *begin = it;
    return it < end;
}